

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Daemon.cpp
# Opt level: O0

vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
* acquire_locks(IteratorPopCommand *cmd,DatabaseSnapshot *snap)

{
  string_view iterator;
  initializer_list<std::variant<DatasetLock,_IteratorLock>_> __l;
  string *this;
  IteratorPopCommand *in_RSI;
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  *in_RDI;
  IteratorLock *in_stack_fffffffffffffef8;
  variant<DatasetLock,_IteratorLock> *in_stack_ffffffffffffff00;
  IteratorLock *in_stack_ffffffffffffff20;
  allocator_type *in_stack_ffffffffffffff28;
  undefined8 **ppuVar1;
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  *in_stack_ffffffffffffff30;
  undefined8 **ppuVar2;
  iterator in_stack_ffffffffffffff38;
  undefined1 **ppuVar3;
  undefined1 *local_50 [5];
  undefined8 *local_28;
  undefined8 local_20;
  
  this = IteratorPopCommand::get_iterator_id_abi_cxx11_(in_RSI);
  std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
  iterator._M_str = (char *)in_stack_ffffffffffffff30;
  iterator._M_len = (size_t)in_stack_ffffffffffffff28;
  IteratorLock::IteratorLock(in_stack_ffffffffffffff20,iterator);
  ppuVar3 = local_50;
  std::variant<DatasetLock,IteratorLock>::variant<IteratorLock,void,void,IteratorLock,void>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  local_20 = 1;
  local_28 = ppuVar3;
  std::allocator<std::variant<DatasetLock,_IteratorLock>_>::allocator
            ((allocator<std::variant<DatasetLock,_IteratorLock>_> *)0x15d555);
  __l._M_len = (size_type)ppuVar3;
  __l._M_array = in_stack_ffffffffffffff38;
  std::
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ::vector(in_stack_ffffffffffffff30,__l,in_stack_ffffffffffffff28);
  std::allocator<std::variant<DatasetLock,_IteratorLock>_>::~allocator
            ((allocator<std::variant<DatasetLock,_IteratorLock>_> *)0x15d580);
  ppuVar2 = (undefined8 **)local_50;
  ppuVar1 = &local_28;
  do {
    ppuVar1 = ppuVar1 + -5;
    std::variant<DatasetLock,_IteratorLock>::~variant
              ((variant<DatasetLock,_IteratorLock> *)0x15d5a9);
  } while (ppuVar1 != ppuVar2);
  IteratorLock::~IteratorLock((IteratorLock *)0x15d5ca);
  return in_RDI;
}

Assistant:

std::vector<DatabaseLock> acquire_locks(
    const IteratorPopCommand &cmd,
    [[maybe_unused]] const DatabaseSnapshot *snap) {
    return {IteratorLock(cmd.get_iterator_id())};
}